

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

bool lunasvg_add_font_face_from_data
               (char *family,bool bold,bool italic,void *data,size_t length,
               lunasvg_destroy_func_t destroy_func,void *closure)

{
  bool bVar1;
  FontFaceCache *this;
  undefined7 in_register_00000011;
  allocator<char> local_61;
  FontFace local_60;
  undefined4 local_54;
  string local_50;
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,italic);
  this = lunasvg::fontFaceCache();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,family,&local_61);
  lunasvg::FontFace::FontFace(&local_60,data,length,destroy_func,closure);
  bVar1 = lunasvg::FontFaceCache::addFontFace(this,&local_50,bold,local_54._0_1_,&local_60);
  lunasvg::FontFace::~FontFace(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool lunasvg_add_font_face_from_data(const char* family, bool bold, bool italic, const void* data, size_t length, lunasvg_destroy_func_t destroy_func, void* closure)
{
    return lunasvg::fontFaceCache()->addFontFace(family, bold, italic, lunasvg::FontFace(data, length, destroy_func, closure));
}